

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_config.c
# Opt level: O0

void dump_output(int length_estimate,char *format,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  int in_EDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int free_tmp;
  va_list ap;
  char *tmp;
  char buf [1024];
  undefined1 auStack_4f8 [16];
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  int local_43c;
  undefined4 local_438;
  undefined4 local_434;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  undefined1 local_418 [1032];
  char *local_10;
  int local_4;
  
  if (in_AL != '\0') {
    local_4c8 = in_XMM0_Qa;
    local_4b8 = in_XMM1_Qa;
    local_4a8 = in_XMM2_Qa;
    local_498 = in_XMM3_Qa;
    local_488 = in_XMM4_Qa;
    local_478 = in_XMM5_Qa;
    local_468 = in_XMM6_Qa;
    local_458 = in_XMM7_Qa;
  }
  local_420 = local_418;
  local_43c = 0;
  if (IP_config_output_len != -1) {
    local_4e8 = in_RDX;
    local_4e0 = in_RCX;
    local_4d8 = in_R8;
    local_4d0 = in_R9;
    local_10 = in_RSI;
    local_4 = in_EDI;
    IP_config_diagnostics =
         (char *)realloc(IP_config_diagnostics,(long)(IP_config_output_len + in_EDI + 1));
    local_420 = IP_config_diagnostics + IP_config_output_len;
    if (0x400 < local_4) {
      local_420 = (char *)malloc((long)(local_4 + 1));
      local_43c = local_43c + 1;
    }
    local_430 = &stack0x00000008;
    local_434 = 0x30;
    local_438 = 0x10;
    local_428 = auStack_4f8;
    vsprintf(local_420,local_10,&local_438);
    sVar1 = strlen(local_420);
    IP_config_output_len = (int)sVar1 + IP_config_output_len;
    if (local_43c != 0) {
      free(local_420);
    }
  }
  return;
}

Assistant:

static void
dump_output(int length_estimate, char *format, ...)
{
    char buf[1024];
    char *tmp = &buf[0];
    va_list ap;
    int free_tmp = 0;

    if (IP_config_output_len == -1) return;

    IP_config_diagnostics = realloc(IP_config_diagnostics, IP_config_output_len + length_estimate + 1);
    tmp = IP_config_diagnostics + IP_config_output_len;

    if (length_estimate > 1024) {
	tmp = malloc(length_estimate + 1);
	free_tmp++;
    }
#ifdef STDC_HEADERS
    va_start(ap, format);
#else
    va_start(ap);
#endif
    vsprintf(tmp, format, ap);
    va_end(ap);
    IP_config_output_len += (int)strlen(tmp);
    if (free_tmp) free(tmp);
}